

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

void __thiscall MetaCommand::ListOptionsXML(MetaCommand *this)

{
  ostream *poVar1;
  pointer pOVar2;
  char *pcVar3;
  int iVar4;
  pointer pFVar5;
  string local_50;
  
  iVar4 = 0;
  for (pOVar2 = (this->m_OptionVector).
                super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pOVar2 != (this->m_OptionVector).
                super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>.
                _M_impl.super__Vector_impl_data._M_finish; pOVar2 = pOVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"<option>");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"<number>");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar4);
    poVar1 = std::operator<<(poVar1,"</number>");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"<name>");
    poVar1 = std::operator<<(poVar1,(pOVar2->name)._M_dataplus._M_p);
    poVar1 = std::operator<<(poVar1,"</name>");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"<tag>");
    poVar1 = std::operator<<(poVar1,(pOVar2->tag)._M_dataplus._M_p);
    poVar1 = std::operator<<(poVar1,"</tag>");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"<description>");
    poVar1 = std::operator<<(poVar1,(pOVar2->description)._M_dataplus._M_p);
    poVar1 = std::operator<<(poVar1,"</description>");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::operator<<((ostream *)&std::cout,"<required>");
    pcVar3 = "0</required>";
    if (pOVar2->required != false) {
      pcVar3 = "1</required>";
    }
    poVar1 = std::operator<<((ostream *)&std::cout,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"<nvalues>");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"</nvalues>");
    std::endl<char,std::char_traits<char>>(poVar1);
    for (pFVar5 = (pOVar2->fields).
                  super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar5 != (pOVar2->fields).
                  super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pFVar5 = pFVar5 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"<field>");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"<name>");
      poVar1 = std::operator<<(poVar1,(pFVar5->name)._M_dataplus._M_p);
      poVar1 = std::operator<<(poVar1,"</name>");
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"<description>");
      poVar1 = std::operator<<(poVar1,(pFVar5->description)._M_dataplus._M_p);
      poVar1 = std::operator<<(poVar1,"</description>");
      std::endl<char,std::char_traits<char>>(poVar1);
      pcVar3 = "<type>";
      poVar1 = std::operator<<((ostream *)&std::cout,"<type>");
      TypeToString_abi_cxx11_(&local_50,(MetaCommand *)pcVar3,pFVar5->type);
      poVar1 = std::operator<<(poVar1,local_50._M_dataplus._M_p);
      poVar1 = std::operator<<(poVar1,"</type>");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&local_50);
      poVar1 = std::operator<<((ostream *)&std::cout,"<value>");
      poVar1 = std::operator<<(poVar1,(pFVar5->value)._M_dataplus._M_p);
      poVar1 = std::operator<<(poVar1,"</value>");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<((ostream *)&std::cout,"<external>");
      pcVar3 = "1</external>";
      if (pFVar5->externaldata == DATA_NONE) {
        pcVar3 = "0</external>";
      }
      poVar1 = std::operator<<((ostream *)&std::cout,pcVar3);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<((ostream *)&std::cout,"<required>");
      pcVar3 = "0</required>";
      if (pFVar5->required != false) {
        pcVar3 = "1</required>";
      }
      poVar1 = std::operator<<((ostream *)&std::cout,pcVar3);
      std::endl<char,std::char_traits<char>>(poVar1);
      poVar1 = std::operator<<((ostream *)&std::cout,"</field>");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"</option>");
    std::endl<char,std::char_traits<char>>(poVar1);
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

void MetaCommand::ListOptionsXML()
{
  OptionVector::const_iterator it = m_OptionVector.begin();
  int i=0;
  while(it != m_OptionVector.end())
    {
    METAIO_STREAM::cout << "<option>" << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "<number>" << i << "</number>" << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "<name>" << (*it).name.c_str() << "</name>" << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "<tag>" << (*it).tag.c_str() << "</tag>" << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "<description>" << (*it).description.c_str()
                                 << "</description>" << METAIO_STREAM::endl;
    METAIO_STREAM::cout << "<required>";
    if((*it).required)
      {
      METAIO_STREAM::cout << "1</required>" << METAIO_STREAM::endl;
      }
    else
      {
      METAIO_STREAM::cout << "0</required>" << METAIO_STREAM::endl;
      }

    METAIO_STREAM::cout << "<nvalues>" << (*it).fields.size() << "</nvalues>" << METAIO_STREAM::endl;

    auto itField = (*it).fields.begin();
    while(itField != (*it).fields.end())
      {
      METAIO_STREAM::cout << "<field>" << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "<name>" << (*itField).name.c_str() << "</name>" << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "<description>" << (*itField).description.c_str()
                                   << "</description>" << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "<type>" << this->TypeToString((*itField).type).c_str()
                            << "</type>" << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "<value>" << (*itField).value.c_str() << "</value>"
                             << METAIO_STREAM::endl;
      METAIO_STREAM::cout << "<external>";
      if((*itField).externaldata)
        {
        METAIO_STREAM::cout << "1</external>" << METAIO_STREAM::endl;
        }
      else
        {
        METAIO_STREAM::cout << "0</external>" << METAIO_STREAM::endl;
        }
      METAIO_STREAM::cout << "<required>";
      if((*itField).required)
        {
        METAIO_STREAM::cout << "1</required>" << METAIO_STREAM::endl;
        }
      else
        {
        METAIO_STREAM::cout << "0</required>" << METAIO_STREAM::endl;
        }


      METAIO_STREAM::cout << "</field>" << METAIO_STREAM::endl;
      ++itField;
      }
    METAIO_STREAM::cout << "</option>" << METAIO_STREAM::endl;
    ++i;
    ++it;
    }
}